

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O2

ssize_t uudecode_filter_read(archive_read_filter *self,void **buff)

{
  ssize_t request;
  ssize_t sVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte *b;
  size_t size;
  long lVar6;
  long lVar7;
  char *pcVar8;
  uudecode *puVar9;
  long lVar10;
  byte bVar11;
  byte *pbVar12;
  archive_read *a;
  ulong uVar13;
  ulong uVar14;
  size_t __n;
  ssize_t sVar15;
  byte *pbVar16;
  byte *pbVar17;
  ssize_t avail_in;
  uudecode *local_58;
  long local_50;
  ssize_t local_48;
  void **local_40;
  ssize_t nl;
  
  local_58 = (uudecode *)self->data;
  local_40 = buff;
LAB_001396f3:
  b = (byte *)__archive_read_filter_ahead(self->upstream,1,&avail_in);
  puVar9 = local_58;
  if (b == (byte *)0x0 && avail_in < 0) {
    return -0x1e;
  }
  if (b == (byte *)0x0) {
    avail_in = 0;
  }
  local_48 = avail_in;
  if (local_58->state != 4) {
    pbVar17 = local_58->out_buff;
    if ((long)local_58->in_cnt != 0) {
      iVar3 = ensure_in_buff_size(self,local_58,local_58->in_cnt + avail_in);
      if (iVar3 != 0) {
        return -0x1e;
      }
      memcpy(puVar9->in_buff + puVar9->in_cnt,b,avail_in);
      b = puVar9->in_buff;
      avail_in = puVar9->in_cnt + avail_in;
      puVar9->in_cnt = 0;
    }
    lVar7 = 0;
    lVar10 = 0;
    do {
      sVar15 = avail_in;
      if (avail_in - lVar7 == 0 || avail_in < lVar7) goto LAB_00139d34;
      local_50 = lVar7;
      size = get_line(b,avail_in - lVar7,&nl);
      sVar1 = nl;
      request = local_48;
      if ((long)size < 0) {
        if ((puVar9->state != 0) || ((puVar9->total < 1 && (lVar10 < 1)))) {
LAB_00139cf3:
          a = self->archive;
          pcVar8 = "Insufficient compressed data";
          iVar3 = -1;
          goto LAB_00139d05;
        }
        puVar9->state = 4;
        lVar7 = sVar15;
        goto LAB_00139d34;
      }
      iVar3 = puVar9->state;
      if (nl == 0) {
        if (iVar3 != 2) goto LAB_00139c67;
LAB_00139848:
        if ((size - nl != 3) || (iVar3 = bcmp(b,"end ",3), iVar3 != 0)) goto LAB_00139cf3;
LAB_00139877:
        puVar9->state = 0;
      }
      else {
        lVar6 = size * 2 + lVar10;
        lVar7 = local_50;
        if (iVar3 == 1) {
          if (lVar6 < 0x10001) {
            if ((""[*b] != '\0') && (0 < (long)(size - nl))) {
              uVar4 = *b & 0x3f;
              uVar13 = (ulong)uVar4 ^ 0x20;
              if (uVar13 < size - nl) {
                if ((char)uVar4 == ' ') {
                  puVar9->state = 2;
                }
                else {
                  pbVar2 = b + 1;
                  while (pbVar16 = pbVar17, uVar14 = uVar13, pbVar12 = pbVar2, lVar7 = lVar10,
                        lVar10 = lVar7, pbVar17 = pbVar16, 0 < (long)uVar14) {
                    if ((""[*pbVar12] == '\0') || (""[pbVar12[1]] == '\0')) goto LAB_00139cf3;
                    iVar3 = (pbVar12[1] & 0x3f ^ 0x20) << 0xc;
                    *pbVar16 = (byte)(((*pbVar12 ^ 0x20) << 0x12) >> 0x10) |
                               (byte)((uint)iVar3 >> 0x10);
                    lVar10 = lVar7 + 1;
                    pbVar2 = pbVar12 + 2;
                    uVar13 = 0;
                    pbVar17 = pbVar16 + 1;
                    if (uVar14 != 1) {
                      bVar11 = pbVar12[2];
                      if (""[bVar11] == '\0') goto LAB_00139cf3;
                      iVar5 = (bVar11 & 0x3f ^ 0x20) << 6;
                      pbVar16[1] = (byte)((uint)iVar3 >> 8) | (byte)((uint)iVar5 >> 8);
                      lVar10 = lVar7 + 2;
                      pbVar2 = pbVar12 + 3;
                      uVar13 = 0;
                      pbVar17 = pbVar16 + 2;
                      if (uVar14 != 2) {
                        bVar11 = pbVar12[3];
                        if (""[bVar11] == '\0') goto LAB_00139cf3;
                        pbVar16[2] = ((byte)iVar5 | bVar11 & 0x3f) ^ 0x20;
                        lVar10 = lVar7 + 3;
                        pbVar2 = pbVar12 + 4;
                        uVar13 = uVar14 - 3;
                        pbVar17 = pbVar16 + 3;
                      }
                    }
                  }
                }
                goto LAB_00139c3d;
              }
            }
            goto LAB_00139cf3;
          }
          goto LAB_00139d34;
        }
        if (iVar3 == 2) goto LAB_00139848;
        if (iVar3 == 3) {
          if (lVar6 < 0x10001) {
            uVar13 = size - nl;
            pbVar2 = b;
            if (((((long)uVar13 < 3) || (*b != 0x3d)) || (b[1] != 0x3d)) || (b[2] != 0x3d)) {
              while (pbVar16 = pbVar17, uVar14 = uVar13, pbVar12 = pbVar2, lVar7 = lVar10,
                    lVar10 = lVar7, pbVar17 = pbVar16, 0 < (long)uVar14) {
                bVar11 = *pbVar12;
                if ((""[bVar11] == '\0') || (""[pbVar12[1]] == '\0')) goto LAB_00139c2d;
                iVar3 = base64num[pbVar12[1]];
                *pbVar16 = (byte)((uint)(base64num[bVar11] << 0x12) >> 0x10) |
                           (byte)((uint)(iVar3 << 0xc) >> 0x10);
                lVar10 = lVar7 + 1;
                pbVar2 = pbVar12 + 2;
                uVar13 = uVar14 - 2;
                pbVar17 = pbVar16 + 1;
                if (2 < uVar14) {
                  uVar13 = (ulong)pbVar12[2];
                  if (uVar13 == 0x3d) goto LAB_00139c3d;
                  if (""[uVar13] == '\0') goto LAB_00139cf3;
                  iVar5 = base64num[uVar13];
                  pbVar16[1] = (byte)((uint)(iVar3 << 0xc) >> 8) | (byte)((uint)(iVar5 << 6) >> 8);
                  lVar10 = lVar7 + 2;
                  pbVar2 = pbVar12 + 3;
                  uVar13 = 0;
                  pbVar17 = pbVar16 + 2;
                  if (uVar14 != 3) {
                    uVar13 = (ulong)pbVar12[3];
                    if (uVar13 == 0x3d) goto LAB_00139c3d;
                    if (""[uVar13] == '\0') goto LAB_00139cf3;
                    pbVar16[2] = (byte)(iVar5 << 6) | (byte)base64num[uVar13];
                    lVar10 = lVar7 + 3;
                    pbVar2 = pbVar12 + 4;
                    uVar13 = uVar14 - 4;
                    pbVar17 = pbVar16 + 3;
                  }
                }
              }
              if (uVar14 != 0) {
                bVar11 = *pbVar12;
LAB_00139c2d:
                if (bVar11 != 0x3d) goto LAB_00139cf3;
              }
              goto LAB_00139c3d;
            }
            goto LAB_00139877;
          }
          goto LAB_00139d34;
        }
        if (0x1ffff < (long)(size + lVar10)) {
          a = self->archive;
          pcVar8 = "Invalid format data";
          goto LAB_00139d84;
        }
        uVar13 = size - nl;
        if (10 < (long)uVar13) {
          lVar7 = 6;
          iVar3 = bcmp(b,"begin ",6);
          if (iVar3 == 0) {
LAB_00139b49:
            puVar9 = local_58;
            if ((((b[lVar7] & 0xf8) == 0x30) && ((b[lVar7 + 1] & 0xf8) == 0x30)) &&
               (((b[lVar7 + 2] & 0xf8) == 0x30 && (b[lVar7 + 3] == 0x20)))) {
              local_58->state = (iVar3 != 0) + 1 + (uint)(iVar3 != 0);
              local_58->mode =
                   ((uint)b[lVar7] * 0x40 + (uint)b[lVar7 + 1] * 8 + (uint)b[lVar7 + 2]) - 0xdb0;
              local_58->mode_set = 1;
              lVar6 = size - (sVar1 + lVar7);
              __n = lVar6 - 4;
              if (1 < (long)__n) {
                free(local_58->name);
                pcVar8 = (char *)malloc(lVar6 - 3);
                puVar9->name = pcVar8;
                if (pcVar8 == (char *)0x0) {
                  a = self->archive;
                  pcVar8 = "Can\'t allocate data for uudecode";
                  iVar3 = 0xc;
                  goto LAB_00139d05;
                }
                strncpy(pcVar8,(char *)(b + lVar7 + 4),__n);
                pcVar8[__n] = '\0';
              }
            }
          }
          else if (0x11 < uVar13) {
            lVar7 = 0xd;
            iVar5 = bcmp(b,"begin-base64 ",0xd);
            if (iVar5 == 0) goto LAB_00139b49;
          }
        }
      }
LAB_00139c3d:
      b = b + size;
      lVar7 = local_50 + size;
      puVar9 = local_58;
    } while( true );
  }
  lVar10 = 0;
  lVar7 = avail_in;
  sVar15 = avail_in;
  goto LAB_00139d34;
LAB_00139c67:
  if (local_48 < 1 && lVar10 == 0) {
    a = self->archive;
    pcVar8 = "Missing format data";
LAB_00139d84:
    iVar3 = 0x54;
LAB_00139d05:
    archive_set_error(&a->archive,iVar3,pcVar8);
  }
  else {
    iVar3 = ensure_in_buff_size(self,puVar9,size);
    if (iVar3 == 0) {
      if (puVar9->in_buff != b) {
        memmove(puVar9->in_buff,b,size);
      }
      local_58->in_cnt = (int)size;
      if (lVar10 != 0) {
        lVar7 = local_50 + size;
        sVar15 = avail_in;
LAB_00139d34:
        lVar6 = 0;
        if (local_48 < sVar15) {
          lVar6 = local_48 - sVar15;
        }
        __archive_read_filter_consume(self->upstream,lVar6 + lVar7);
        *local_40 = local_58->out_buff;
        local_58->total = local_58->total + lVar10;
        return lVar10;
      }
      __archive_read_filter_consume(self->upstream,request);
      goto LAB_001396f3;
    }
  }
  return -0x1e;
}

Assistant:

static ssize_t
uudecode_filter_read(struct archive_read_filter *self, const void **buff)
{
	struct uudecode *uudecode;
	const unsigned char *b, *d;
	unsigned char *out;
	ssize_t avail_in, ravail;
	ssize_t used;
	ssize_t total;
	ssize_t len, llen, nl, namelen;

	uudecode = (struct uudecode *)self->data;

read_more:
	d = __archive_read_filter_ahead(self->upstream, 1, &avail_in);
	if (d == NULL && avail_in < 0)
		return (ARCHIVE_FATAL);
	/* Quiet a code analyzer; make sure avail_in must be zero
	 * when d is NULL. */
	if (d == NULL)
		avail_in = 0;
	used = 0;
	total = 0;
	out = uudecode->out_buff;
	ravail = avail_in;
	if (uudecode->state == ST_IGNORE) {
		used = avail_in;
		goto finish;
	}
	if (uudecode->in_cnt) {
		/*
		 * If there is remaining data which is saved by
		 * previous calling, use it first.
		 */
		if (ensure_in_buff_size(self, uudecode,
		    avail_in + uudecode->in_cnt) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		#ifdef __clang_analyzer__
		assert(d);
		#endif
		memcpy(uudecode->in_buff + uudecode->in_cnt,
		    d, avail_in);
		d = uudecode->in_buff;
		avail_in += uudecode->in_cnt;
		uudecode->in_cnt = 0;
	}
	for (;used < avail_in; d += llen, used += llen) {
		int64_t l, body;

		b = d;
		len = get_line(b, avail_in - used, &nl);
		if (len < 0) {
			/* Non-ascii character is found. */
			if (uudecode->state == ST_FIND_HEAD &&
			    (uudecode->total > 0 || total > 0)) {
				uudecode->state = ST_IGNORE;
				used = avail_in;
				goto finish;
			}
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Insufficient compressed data");
			return (ARCHIVE_FATAL);
		}
		llen = len;
		if ((nl == 0) && (uudecode->state != ST_UUEND)) {
			if (total == 0 && ravail <= 0) {
				/* There is nothing more to read, fail */
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Missing format data");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Save remaining data which does not contain
			 * NL('\n','\r').
			 */
			if (ensure_in_buff_size(self, uudecode, len)
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			if (uudecode->in_buff != b)
				memmove(uudecode->in_buff, b, len);
			uudecode->in_cnt = (int)len;
			if (total == 0) {
				/* Do not return 0; it means end-of-file.
				 * We should try to read bytes more. */
				__archive_read_filter_consume(
				    self->upstream, ravail);
				goto read_more;
			}
			used += len;
			break;
		}
		switch (uudecode->state) {
		default:
		case ST_FIND_HEAD:
			/* Do not read more than UUENCODE_BID_MAX_READ bytes */
			if (total + len >= UUENCODE_BID_MAX_READ) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Invalid format data");
				return (ARCHIVE_FATAL);
			}
			if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
				l = 6;
			else if (len - nl >= 18 &&
			    memcmp(b, "begin-base64 ", 13) == 0)
				l = 13;
			else
				l = 0;
			if (l != 0 && b[l] >= '0' && b[l] <= '7' &&
			    b[l+1] >= '0' && b[l+1] <= '7' &&
			    b[l+2] >= '0' && b[l+2] <= '7' && b[l+3] == ' ') {
				if (l == 6)
					uudecode->state = ST_READ_UU;
				else
					uudecode->state = ST_READ_BASE64;
				uudecode->mode = (mode_t)(
				    ((int)(b[l] - '0') * 64) +
				    ((int)(b[l+1] - '0') * 8) +
				     (int)(b[l+2] - '0'));
				uudecode->mode_set = 1;
				namelen = len - nl - 4 - l;
				if (namelen > 1) {
					if (uudecode->name != NULL)
						free(uudecode->name);
					uudecode->name = malloc(namelen + 1);
			                if (uudecode->name == NULL) {
					archive_set_error(
					    &self->archive->archive,
					    ENOMEM,
					    "Can't allocate data for uudecode");
						return (ARCHIVE_FATAL);
					}
					strncpy(uudecode->name,
					    (const char *)(b + l + 4),
					    namelen);
					uudecode->name[namelen] = '\0';
				}
			}
			break;
		case ST_READ_UU:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			body = len - nl;
			if (!uuchar[*b] || body <= 0) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			/* Get length of undecoded bytes of current line. */
			l = UUDECODE(*b++);
			body--;
			if (l > body) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			if (l == 0) {
				uudecode->state = ST_UUEND;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!uuchar[b[0]] || !uuchar[b[1]])
					break;
				n = UUDECODE(*b++) << 18;
				n |= UUDECODE(*b++) << 12;
				*out++ = n >> 16; total++;
				--l;

				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++) << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (!uuchar[b[0]])
						break;
					n |= UUDECODE(*b++);
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_UUEND:
			if (len - nl == 3 && memcmp(b, "end ", 3) == 0)
				uudecode->state = ST_FIND_HEAD;
			else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		case ST_READ_BASE64:
			if (total + len * 2 > OUT_BUFF_SIZE)
				goto finish;
			l = len - nl;
			if (l >= 3 && b[0] == '=' && b[1] == '=' &&
			    b[2] == '=') {
				uudecode->state = ST_FIND_HEAD;
				break;
			}
			while (l > 0) {
				int n = 0;

				if (!base64[b[0]] || !base64[b[1]])
					break;
				n = base64num[*b++] << 18;
				n |= base64num[*b++] << 12;
				*out++ = n >> 16; total++;
				l -= 2;

				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++] << 6;
					*out++ = (n >> 8) & 0xFF; total++;
					--l;
				}
				if (l > 0) {
					if (*b == '=')
						break;
					if (!base64[*b])
						break;
					n |= base64num[*b++];
					*out++ = n & 0xFF; total++;
					--l;
				}
			}
			if (l && *b != '=') {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Insufficient compressed data");
				return (ARCHIVE_FATAL);
			}
			break;
		}
	}
finish:
	if (ravail < avail_in)
		used -= avail_in - ravail;
	__archive_read_filter_consume(self->upstream, used);

	*buff = uudecode->out_buff;
	uudecode->total += total;
	return (total);
}